

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

double __thiscall
MADPComponentDiscreteStates::GetInitialStateProbability(MADPComponentDiscreteStates *this,Index sI)

{
  pointer pdVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"MADPComponentDiscreteStates::GetInitialStateProbability(",0x38);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - Error: not initialized. ",0x1c);
    std::endl<char,std::char_traits<char>>(poVar2);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar3 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar3,&E::typeinfo,E::~E);
  }
  pdVar1 = (this->_m_initialStateDistribution->super_SDV).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ulong)sI <
      (ulong)((long)(this->_m_initialStateDistribution->super_SDV).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
    return pdVar1[sI];
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,
             "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds"
             ,0x6d);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

double MADPComponentDiscreteStates::GetInitialStateProbability(Index sI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::GetInitialStateProbability("<< 
        sI<<") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    
    if(sI < _m_initialStateDistribution->size() )
    {
        if(DEBUG_MADP_DSTATES)    cout << "MultiAgentDecisionProcess::GetInitialStateProbability - index "<<sI<<" is okay, size is "<<_m_initialStateDistribution->size() <<endl;
        return(_m_initialStateDistribution->at(sI));
    }
    //else
    stringstream ss;
    ss << "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds";
    throw E(ss);
}